

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double local_38;
  
  uVar1 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar1;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar8 = (long)(int)uVar1 << 3;
      }
      pdVar6 = (double *)operator_new__(uVar8);
      (this->dx_).ptr_to_data = pdVar6;
    }
  }
  if (uVar1 != 0) {
    pdVar6 = (this->dx_).ptr_to_data;
    if ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        lVar9 = 0;
        do {
          pFVar3 = (fadexpr->fadexpr_).right_;
          pdVar7 = &(pFVar3->fadexpr_).expr_.defaultVal;
          if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
            pdVar7 = (double *)((long)(pFVar3->fadexpr_).expr_.dx_.ptr_to_data + lVar9);
          }
          local_38 = -*pdVar7;
          dVar4 = sin((pFVar3->fadexpr_).expr_.val_);
          *(double *)((long)pdVar6 + lVar9) = dVar4 * local_38 * (fadexpr->fadexpr_).left_.constant_
          ;
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar1 * 8 - lVar9 != 0);
      }
    }
    else if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        pFVar3 = (fadexpr->fadexpr_).right_;
        local_38 = -(pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar8];
        dVar4 = sin((pFVar3->fadexpr_).expr_.val_);
        pdVar6[uVar8] = dVar4 * local_38 * (fadexpr->fadexpr_).left_.constant_;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  dVar4 = (fadexpr->fadexpr_).left_.constant_;
  dVar5 = cos((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar5 * dVar4;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}